

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReturnValues.cc
# Opt level: O0

void __thiscall Calculator::execute(Calculator *this)

{
  ostream *poVar1;
  anon_class_8_1_ba1d79ab *in_stack_00000018;
  int sum;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Calculating..");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::operator()
            (&this->executeSignal_,in_stack_00000018);
  poVar1 = std::operator<<((ostream *)&std::cout,"Sum of calculation: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void execute()
  {
    std::cout << "Calculating.." << std::endl;

    int sum = 0;
    executeSignal_([&sum](int retVal) {
      std::cout << "Incoming value: " << retVal << std::endl;
      sum += retVal;
    });

    std::cout << "Sum of calculation: " << sum << std::endl;
  }